

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O1

void __thiscall
DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
::RemoveElement<Memory::ArenaAllocator>
          (DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
           *this,ArenaAllocator *allocator,
          ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> **element)

{
  code *pcVar1;
  bool bVar2;
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *pSVar3;
  undefined4 *puVar4;
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> **buffer;
  
  buffer = element + -2;
  pSVar3 = (ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)this;
  do {
    pSVar3 = (ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
             (((DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
                *)pSVar3)->
             super_DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*>
             ).next.node;
    if (pSVar3 == (ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                  this) break;
  } while (pSVar3 != (ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *
                     )buffer);
  if (pSVar3 == (ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)this
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  element[-1]->cache = (PrototypeChainCache<Js::OnlyWritablePropertyCache> *)*buffer;
  (*buffer)->registration =
       (ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> **)element[-1];
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             buffer,0x18);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }